

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

_Bool file_stdio_fflush(ALLEGRO_FILE *f)

{
  int iVar1;
  USERDATA *pUVar2;
  int *piVar3;
  undefined8 in_RDI;
  USERDATA *userdata;
  ALLEGRO_FILE *in_stack_ffffffffffffffe8;
  int errnum;
  
  errnum = (int)((ulong)in_RDI >> 0x20);
  pUVar2 = get_userdata(in_stack_ffffffffffffffe8);
  iVar1 = fflush((FILE *)pUVar2->fp);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    pUVar2->errnum = *piVar3;
    __errno_location();
    al_set_errno(errnum);
  }
  return iVar1 != -1;
}

Assistant:

static bool file_stdio_fflush(ALLEGRO_FILE *f)
{
   USERDATA *userdata = get_userdata(f);

   if (fflush(userdata->fp) == EOF) {
      userdata->errnum = errno;
      al_set_errno(errno);
      return false;
   }

   return true;
}